

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

mat<4UL,_4UL> * mat<4UL,_4UL>::identity(void)

{
  vec<4UL,_double> *this;
  double *pdVar1;
  size_t idx;
  size_t i_00;
  mat<4UL,_4UL> *in_RDI;
  undefined8 local_30;
  undefined8 local_18;
  size_t j;
  size_t i;
  
  mat(in_RDI);
  j = 4;
  while (idx = j - 1, j != 0) {
    local_18 = 4;
    while (i_00 = local_18 - 1, j = idx, local_18 != 0) {
      local_30 = 1.0;
      if (idx != i_00) {
        local_30 = 0.0;
      }
      this = operator[](in_RDI,idx);
      pdVar1 = vec<4UL,_double>::operator[](this,i_00);
      *pdVar1 = local_30;
      local_18 = i_00;
    }
  }
  return in_RDI;
}

Assistant:

static mat<nrows, ncols> identity()
    {
        mat<nrows, ncols> ret;
        for (size_t i = nrows; i--;)
            for (size_t j = ncols; j--; ret[i][j] = (i == j))
                ;
        return ret;
    }